

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,quatd *v)

{
  ostream *poVar1;
  const_reference pvVar2;
  _anonymous_namespace_ *p_Var3;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  quatd *local_18;
  quatd *v_local;
  ostream *os_local;
  
  p_Var3 = (_anonymous_namespace_ *)0xa097dd;
  local_18 = v;
  v_local = (quatd *)os;
  poVar1 = std::operator<<(os,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_38,p_Var3,local_18->real);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,", ");
  p_Var3 = (_anonymous_namespace_ *)0x0;
  pvVar2 = array<double,_3UL>::operator[](&local_18->imag,0);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_58,p_Var3,*pvVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,", ");
  p_Var3 = (_anonymous_namespace_ *)0x1;
  pvVar2 = array<double,_3UL>::operator[](&local_18->imag,1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_78,p_Var3,*pvVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  poVar1 = std::operator<<(poVar1,", ");
  p_Var3 = (_anonymous_namespace_ *)0x2;
  pvVar2 = array<double,_3UL>::operator[](&local_18->imag,2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_98,p_Var3,*pvVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)v_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::quatd &v) {
  os << "(" << tinyusdz::dtos(v.real) << ", " << tinyusdz::dtos(v.imag[0])
     << ", " << tinyusdz::dtos(v.imag[1]) << ", " << tinyusdz::dtos(v.imag[2])
     << ")";
  return os;
}